

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O0

tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
* packing::overloadAndRemove
            (tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
             *__return_storage_ptr__,
            vector<ProtoPalette,_std::allocator<ProtoPalette>_> *protoPalettes)

{
  allocator<packing::ProtoPalAttrs> *this;
  anon_class_16_2_51b86422_for__M_comp __comp;
  FILE *pFVar1;
  unsigned_long uVar2;
  pointer puVar3;
  bool bVar4;
  byte bVar5;
  size_type sVar6;
  iterator iVar7;
  iterator iVar8;
  size_t sVar9;
  type *this_00;
  type *this_01;
  pointer prVar10;
  reference pvVar11;
  difference_type dVar12;
  pointer this_02;
  reference pAVar13;
  reference prVar14;
  const_reference pvVar15;
  const_iterator pvVar16;
  size_t sVar17;
  value_type *pvVar18;
  reference pvVar19;
  reference pvVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  iterator iVar24;
  iterator iVar25;
  iterator iVar26;
  iterator iVar27;
  size_type local_3b0;
  reference local_3a8;
  ProtoPalAttrs *attrs_5;
  iterator __end2_2;
  iterator __begin2_2;
  value_type *__range2_2;
  size_t i_2;
  undefined1 local_368 [8];
  DefaultInitVec<size_t> mappings;
  value_type_conflict2 *colorIndex_1;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  value_type *__range4_1;
  remove_const_t<value_type> *attrs_4;
  iterator __end3_2;
  iterator __begin3_2;
  AssignedProtos *__range3_2;
  AssignedProtos *assignment_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> *__range2_1;
  value_type_conflict2 *colorIndex;
  const_iterator __end4;
  const_iterator __begin4;
  value_type *__range4;
  remove_const_t<value_type> *attrs_3;
  iterator __end3_1;
  iterator __begin3_1;
  AssignedProtos *__range3_1;
  AssignedProtos *assignment;
  iterator __end2;
  iterator __begin2;
  vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> *__range2;
  __normal_iterator<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
  local_268;
  AssignedProtos *local_260;
  AssignedProtos *local_258;
  __normal_iterator<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
  local_250;
  __normal_iterator<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
  local_248;
  __normal_iterator<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
  iter;
  ProtoPalette *protoPal_1;
  ProtoPalAttrs *attrs_2;
  ProtoPalAttrs *attrs_1;
  iterator __end3;
  iterator __begin3;
  AssignedProtos *__range3;
  AssignedProtos *pal;
  iterator __end1;
  iterator __begin1;
  vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> *__range1;
  type *maxEfficiencyIter;
  type *minEfficiencyIter;
  pair<packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>,_packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>_>
  local_1a0;
  anon_class_8_1_7660daf7 local_180;
  anon_class_8_1_7660daf7 efficiency;
  value_type *bestPal;
  size_t i_1;
  double bestRelSize;
  size_t bestPalIndex;
  ProtoPalette *protoPal;
  ProtoPalAttrs *attrs;
  vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> assignments;
  deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> local_118;
  undefined1 local_c8 [8];
  queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
  queue;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_60;
  const_iterator local_58;
  unsigned_long local_50;
  size_t i;
  default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_> local_31;
  undefined1 local_30 [8];
  DefaultInitVec<size_t> sortedProtoPalIDs;
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> *protoPalettes_local;
  
  sortedProtoPalIDs.
  super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)protoPalettes;
  Options::verbosePrint
            (&options,'\x02',"Paginating palettes using \"overload-and-remove\" strategy...\n");
  sVar6 = std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::size
                    ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                     sortedProtoPalIDs.
                     super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>::default_init_allocator
            (&local_31);
  std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::vector((vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
            *)local_30,sVar6,&local_31);
  default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>::~default_init_allocator
            (&local_31);
  std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::clear((vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
           *)local_30);
  for (local_50 = 0; uVar2 = local_50,
      sVar6 = std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::size
                        ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                         sortedProtoPalIDs.
                         super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar2 < sVar6;
      local_50 = local_50 + 1) {
    iVar7 = std::
            vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::begin((vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                     *)local_30);
    iVar8 = std::
            vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::end((vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                   *)local_30);
    local_60 = std::
               lower_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>>,unsigned_long>
                         (iVar7._M_current,iVar8._M_current,&local_50);
    __gnu_cxx::
    __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>>
    ::__normal_iterator<unsigned_long*>
              ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>>
                *)&local_58,&local_60);
    queue.c.super__Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_node =
         (_Map_pointer)
         std::
         vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
         ::insert((vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                   *)local_30,local_58,&local_50);
  }
  iVar7 = std::
          vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::begin((vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                   *)local_30);
  iVar8 = std::
          vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::end((vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                 *)local_30);
  this = (allocator<packing::ProtoPalAttrs> *)
         ((long)&assignments.
                 super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<packing::ProtoPalAttrs>::allocator(this);
  std::deque<packing::ProtoPalAttrs,std::allocator<packing::ProtoPalAttrs>>::
  deque<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>>,void>
            ((deque<packing::ProtoPalAttrs,std::allocator<packing::ProtoPalAttrs>> *)&local_118,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              )iVar7._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              )iVar8._M_current,this);
  std::
  queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
  ::queue((queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
           *)local_c8,&local_118);
  std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::~deque(&local_118);
  std::allocator<packing::ProtoPalAttrs>::~allocator
            ((allocator<packing::ProtoPalAttrs> *)
             ((long)&assignments.
                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  memset(&attrs,0,0x18);
  std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::vector
            ((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> *)&attrs);
  do {
    bVar4 = std::
            queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
            ::empty((queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
                     *)local_c8);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      __end1 = std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::begin
                         ((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                           *)&attrs);
      pal = (AssignedProtos *)
            std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::end
                      ((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> *)
                       &attrs);
      while (bVar4 = __gnu_cxx::
                     operator==<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
                               (&__end1,(__normal_iterator<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
                                         *)&pal), ((bVar4 ^ 0xffU) & 1) != 0) {
        pAVar13 = __gnu_cxx::
                  __normal_iterator<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
                  ::operator*(&__end1);
        sVar17 = AssignedProtos::volume(pAVar13);
        bVar5 = Options::maxOpaqueColors(&options);
        if (bVar5 < sVar17) {
          iVar26 = AssignedProtos::begin(pAVar13);
          __end3._iter._M_current = (optional<packing::ProtoPalAttrs> *)iVar26._array;
          iVar24 = AssignedProtos::end(pAVar13);
          while( true ) {
            __end3._array = (remove_const_t<decltype(_assigned)> *)iVar24._iter._M_current;
            attrs_1 = (ProtoPalAttrs *)iVar24._array;
            bVar4 = AssignedProtos::
                    Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                    ::operator!=((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                  *)&__end3._iter,
                                 (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                  *)&attrs_1);
            if (!bVar4) break;
            prVar14 = AssignedProtos::
                      Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                      ::operator*((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                   *)&__end3._iter);
            std::
            queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
            ::emplace<packing::ProtoPalAttrs>
                      ((queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
                        *)local_c8,prVar14);
            AssignedProtos::
            Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
            ::operator++((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                          *)&__end3._iter);
            iVar24._iter._M_current = (optional<packing::ProtoPalAttrs> *)__end3._array;
            iVar24._array = (remove_const_t<decltype(_assigned)> *)attrs_1;
          }
          AssignedProtos::clear(pAVar13);
        }
        __gnu_cxx::
        __normal_iterator<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
        ::operator++(&__end1);
      }
      while (bVar4 = std::
                     queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
                     ::empty((queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
                              *)local_c8), ((bVar4 ^ 0xffU) & 1) != 0) {
        pvVar11 = std::
                  queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
                  ::front((queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
                           *)local_c8);
        iter._M_current =
             (AssignedProtos *)
             std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::operator[]
                       ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                        sortedProtoPalIDs.
                        super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar11->protoPalIndex);
        local_250._M_current =
             (AssignedProtos *)
             std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::begin
                       ((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> *
                        )&attrs);
        local_258 = (AssignedProtos *)
                    std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::
                    end((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> *
                        )&attrs);
        local_260 = iter._M_current;
        local_248 = std::
                    find_if<__gnu_cxx::__normal_iterator<packing::AssignedProtos*,std::vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>>>,packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__1>
                              (local_250,
                               (__normal_iterator<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
                                )local_258,iter._M_current);
        local_268._M_current =
             (AssignedProtos *)
             std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::end
                       ((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> *
                        )&attrs);
        bVar4 = __gnu_cxx::
                operator==<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
                          (&local_248,&local_268);
        if (bVar4) {
          sVar6 = std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::
                  size((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> *)
                       &attrs);
          Options::verbosePrint
                    (&options,'\x04',"Adding new palette (%zu) for overflowing proto-pal %zu\n",
                     sVar6,pvVar11->protoPalIndex);
          std::vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>>::
          emplace_back<std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&,packing::ProtoPalAttrs_const>
                    ((vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>> *)
                     &attrs,(vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                            sortedProtoPalIDs.
                            super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar11);
        }
        else {
          sVar17 = pvVar11->protoPalIndex;
          __range2 = (vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> *)
                     std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ::begin((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                              *)&attrs);
          dVar12 = __gnu_cxx::operator-
                             (&local_248,
                              (__normal_iterator<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
                               *)&__range2);
          Options::verbosePrint
                    (&options,'\x04',"Assigning overflowing proto-pal %zu to palette %zu\n",sVar17,
                     dVar12);
          this_02 = __gnu_cxx::
                    __normal_iterator<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
                    ::operator->(&local_248);
          AssignedProtos::assign<packing::ProtoPalAttrs_const>(this_02,pvVar11);
        }
        std::
        queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
        ::pop((queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
               *)local_c8);
      }
      if (2 < options.verbosity) {
        __end2 = std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::
                 begin((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> *)
                       &attrs);
        assignment = (AssignedProtos *)
                     std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ::end((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                            *)&attrs);
        while (bVar4 = __gnu_cxx::
                       operator==<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
                                 (&__end2,(__normal_iterator<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
                                           *)&assignment), ((bVar4 ^ 0xffU) & 1) != 0) {
          pAVar13 = __gnu_cxx::
                    __normal_iterator<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
                    ::operator*(&__end2);
          fprintf(_stderr,"{ ");
          iVar26 = AssignedProtos::begin(pAVar13);
          __end3_1._iter._M_current = (optional<packing::ProtoPalAttrs> *)iVar26._array;
          iVar26 = AssignedProtos::end(pAVar13);
          while( true ) {
            __end3_1._array = (remove_const_t<decltype(_assigned)> *)iVar26._iter._M_current;
            attrs_3 = (remove_const_t<value_type> *)iVar26._array;
            bVar4 = AssignedProtos::
                    Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                    ::operator!=((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                  *)&__end3_1._iter,
                                 (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                  *)&attrs_3);
            pFVar1 = _stderr;
            if (!bVar4) break;
            prVar14 = AssignedProtos::
                      Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                      ::operator*((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                   *)&__end3_1._iter);
            fprintf(_stderr,"[%zu] ",prVar14->protoPalIndex);
            pvVar15 = std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::operator[]
                                ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                                 sortedProtoPalIDs.
                                 super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 prVar14->protoPalIndex);
            __end4 = ProtoPalette::begin(pvVar15);
            pvVar16 = ProtoPalette::end(pvVar15);
            for (; __end4 != pvVar16; __end4 = __end4 + 1) {
              fprintf(_stderr,"%04x, ",(ulong)*__end4);
            }
            AssignedProtos::
            Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
            ::operator++((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                          *)&__end3_1._iter);
            iVar26._iter._M_current = (optional<packing::ProtoPalAttrs> *)__end3_1._array;
            iVar26._array = (remove_const_t<decltype(_assigned)> *)attrs_3;
          }
          sVar17 = AssignedProtos::volume(pAVar13);
          fprintf(pFVar1,"} (volume = %zu)\n",sVar17);
          __gnu_cxx::
          __normal_iterator<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
          ::operator++(&__end2);
        }
      }
      decant((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> *)&attrs,
             (vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
             sortedProtoPalIDs.
             super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (2 < options.verbosity) {
        __end2_1 = std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::
                   begin((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                          *)&attrs);
        assignment_1 = (AssignedProtos *)
                       std::
                       vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::
                       end((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                            *)&attrs);
        while (bVar4 = __gnu_cxx::
                       operator==<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
                                 (&__end2_1,
                                  (__normal_iterator<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
                                   *)&assignment_1), ((bVar4 ^ 0xffU) & 1) != 0) {
          pAVar13 = __gnu_cxx::
                    __normal_iterator<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
                    ::operator*(&__end2_1);
          fprintf(_stderr,"{ ");
          iVar26 = AssignedProtos::begin(pAVar13);
          __end3_2._iter._M_current = (optional<packing::ProtoPalAttrs> *)iVar26._array;
          iVar25 = AssignedProtos::end(pAVar13);
          while( true ) {
            __end3_2._array = (remove_const_t<decltype(_assigned)> *)iVar25._iter._M_current;
            attrs_4 = (remove_const_t<value_type> *)iVar25._array;
            bVar4 = AssignedProtos::
                    Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                    ::operator!=((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                  *)&__end3_2._iter,
                                 (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                  *)&attrs_4);
            pFVar1 = _stderr;
            if (!bVar4) break;
            prVar14 = AssignedProtos::
                      Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                      ::operator*((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                   *)&__end3_2._iter);
            fprintf(_stderr,"[%zu] ",prVar14->protoPalIndex);
            pvVar15 = std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::operator[]
                                ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                                 sortedProtoPalIDs.
                                 super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 prVar14->protoPalIndex);
            __end4_1 = ProtoPalette::begin(pvVar15);
            pvVar16 = ProtoPalette::end(pvVar15);
            for (; __end4_1 != pvVar16; __end4_1 = __end4_1 + 1) {
              mappings.
              super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__end4_1;
              fprintf(_stderr,"%04x, ",(ulong)*__end4_1);
            }
            AssignedProtos::
            Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
            ::operator++((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                          *)&__end3_2._iter);
            iVar25._iter._M_current = (optional<packing::ProtoPalAttrs> *)__end3_2._array;
            iVar25._array = (remove_const_t<decltype(_assigned)> *)attrs_4;
          }
          sVar17 = AssignedProtos::volume(pAVar13);
          fprintf(pFVar1,"} (volume = %zu)\n",sVar17);
          __gnu_cxx::
          __normal_iterator<packing::AssignedProtos_*,_std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>_>
          ::operator++(&__end2_1);
        }
      }
      sVar6 = std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::size
                        ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                         sortedProtoPalIDs.
                         super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>::default_init_allocator
                ((default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&i_2 + 7));
      std::
      vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::vector((vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)local_368,sVar6,
               (default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&i_2 + 7));
      default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>::~default_init_allocator
                ((default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&i_2 + 7));
      for (__range2_2 = (value_type *)0x0;
          pvVar18 = (value_type *)
                    std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::
                    size((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                          *)&attrs), __range2_2 < pvVar18;
          __range2_2 = (value_type *)
                       ((long)&(__range2_2->_assigned).
                               super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1)) {
        pvVar19 = std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::
                  operator[]((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                              *)&attrs,(size_type)__range2_2);
        iVar26 = AssignedProtos::begin(pvVar19);
        __end2_2._iter._M_current = (optional<packing::ProtoPalAttrs> *)iVar26._array;
        iVar27 = AssignedProtos::end(pvVar19);
        while( true ) {
          __end2_2._array = (remove_const_t<decltype(_assigned)> *)iVar27._iter._M_current;
          attrs_5 = (ProtoPalAttrs *)iVar27._array;
          bVar4 = AssignedProtos::
                  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                  ::operator!=((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                *)&__end2_2._iter,
                               (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                *)&attrs_5);
          if (!bVar4) break;
          local_3a8 = AssignedProtos::
                      Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                      ::operator*((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                                   *)&__end2_2._iter);
          pvVar20 = std::
                    vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator[]((vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)local_368,local_3a8->protoPalIndex);
          *pvVar20 = (value_type)__range2_2;
          AssignedProtos::
          Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
          ::operator++((Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                        *)&__end2_2._iter);
          iVar27._iter._M_current = (optional<packing::ProtoPalAttrs> *)__end2_2._array;
          iVar27._array = (remove_const_t<decltype(_assigned)> *)attrs_5;
        }
      }
      local_3b0 = std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::
                  size((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> *)
                       &attrs);
      std::
      tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
      ::
      tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>_&,_unsigned_long,_true>
                (__return_storage_ptr__,
                 (vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)local_368,&local_3b0);
      std::
      vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::~vector((vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                 *)local_368);
      std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::~vector
                ((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> *)&attrs
                );
      std::
      queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
      ::~queue((queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
                *)local_c8);
      std::
      vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::~vector((vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                 *)local_30);
      return __return_storage_ptr__;
    }
    pvVar11 = std::
              queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
              ::front((queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
                       *)local_c8);
    Options::verbosePrint(&options,'\x04',"Handling proto-pal %zu\n",pvVar11->protoPalIndex);
    pvVar15 = std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::operator[]
                        ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                         sortedProtoPalIDs.
                         super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar11->protoPalIndex);
    bestRelSize = (double)std::
                          vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                          ::size((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                  *)&attrs);
    sVar17 = ProtoPalette::size(pvVar15);
    auVar23._8_4_ = (int)(sVar17 >> 0x20);
    auVar23._0_8_ = sVar17;
    auVar23._12_4_ = 0x45300000;
    for (bestPal = (value_type *)0x0;
        pvVar18 = (value_type *)
                  std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::
                  size((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> *)
                       &attrs), bestPal < pvVar18;
        bestPal = (value_type *)
                  ((long)&(bestPal->_assigned).
                          super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1)) {
      bVar4 = ProtoPalAttrs::isBannedFrom(pvVar11,(size_t)bestPal);
      if (!bVar4) {
        sVar6 = std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::size
                          ((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                            *)&attrs);
        pvVar19 = std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::
                  operator[]((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                              *)&attrs,(size_type)bestPal);
        dVar21 = AssignedProtos::relSizeOf(pvVar19,pvVar15);
        sVar9 = ProtoPalette::size(pvVar15);
        Options::verbosePrint
                  (&options,'\x04',"%zu/%zu: Rel size: %f (size = %zu)\n",dVar21,
                   (undefined1 *)
                   ((long)&(bestPal->_assigned).
                           super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1),sVar6,sVar9);
        pvVar19 = std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::
                  operator[]((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                              *)&attrs,(size_type)bestPal);
        dVar21 = AssignedProtos::relSizeOf(pvVar19,pvVar15);
        if (dVar21 < (auVar23._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar17) - 4503599627370496.0)) {
          bestRelSize = (double)bestPal;
        }
      }
    }
    dVar21 = (double)std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ::size((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                             *)&attrs);
    if (bestRelSize == dVar21) {
      std::vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>>::
      emplace_back<std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&,packing::ProtoPalAttrs_const>
                ((vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>> *)&attrs,
                 (vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                 sortedProtoPalIDs.
                 super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar11);
    }
    else {
      efficiency.bestPal =
           std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::
           operator[]((vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> *)
                      &attrs,(size_type)bestRelSize);
      AssignedProtos::assign<packing::ProtoPalAttrs_const>(efficiency.bestPal,pvVar11);
      while( true ) {
        sVar17 = AssignedProtos::volume(efficiency.bestPal);
        bVar5 = Options::maxOpaqueColors(&options);
        if (sVar17 <= bVar5) break;
        sVar17 = AssignedProtos::volume(efficiency.bestPal);
        bVar5 = Options::maxOpaqueColors(&options);
        Options::verbosePrint
                  (&options,'\x04',"Palette %zu is overloaded! (%zu > %u)\n",bestRelSize,sVar17,
                   (ulong)bVar5);
        local_180.bestPal = efficiency.bestPal;
        iVar26 = AssignedProtos::begin(efficiency.bestPal);
        iVar25 = AssignedProtos::end(efficiency.bestPal);
        __comp.protoPalettes =
             (vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
             sortedProtoPalIDs.
             super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __comp.efficiency = &local_180;
        std::
        minmax_element<packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,std::remove_const_t>,packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                  (&local_1a0,iVar26,iVar25,__comp);
        this_00 = std::
                  get<0ul,packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,std::remove_const_t>,packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,std::remove_const_t>>
                            (&local_1a0);
        this_01 = std::
                  get<1ul,packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,std::remove_const_t>,packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,std::remove_const_t>>
                            (&local_1a0);
        puVar3 = sortedProtoPalIDs.
                 super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        prVar10 = AssignedProtos::
                  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                  ::operator->(this_01);
        pvVar15 = std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::operator[]
                            ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)puVar3,
                             prVar10->protoPalIndex);
        dVar21 = overloadAndRemove::anon_class_8_1_7660daf7::operator()(&local_180,pvVar15);
        puVar3 = sortedProtoPalIDs.
                 super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        prVar10 = AssignedProtos::
                  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                  ::operator->(this_00);
        pvVar15 = std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::operator[]
                            ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)puVar3,
                             prVar10->protoPalIndex);
        dVar22 = overloadAndRemove::anon_class_8_1_7660daf7::operator()(&local_180,pvVar15);
        if (dVar21 - dVar22 < 0.001) break;
        prVar14 = AssignedProtos::
                  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                  ::operator*(this_00);
        std::
        queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
        ::emplace<packing::ProtoPalAttrs>
                  ((queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
                    *)local_c8,prVar14);
        pvVar11 = std::
                  queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
                  ::back((queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
                          *)local_c8);
        ProtoPalAttrs::banFrom(pvVar11,(size_t)bestRelSize);
        AssignedProtos::remove(efficiency.bestPal,(char *)this_00);
      }
    }
    std::
    queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
    ::pop((queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
           *)local_c8);
  } while( true );
}

Assistant:

std::tuple<DefaultInitVec<size_t>, size_t>
    overloadAndRemove(std::vector<ProtoPalette> const &protoPalettes) {
	options.verbosePrint(Options::VERB_LOG_ACT,
	                     "Paginating palettes using \"overload-and-remove\" strategy...\n");

	// Sort the proto-palettes by size, which improves the packing algorithm's efficiency
	DefaultInitVec<size_t> sortedProtoPalIDs(protoPalettes.size());
	sortedProtoPalIDs.clear();
	for (size_t i = 0; i < protoPalettes.size(); ++i) {
		sortedProtoPalIDs.insert(
		    std::lower_bound(sortedProtoPalIDs.begin(), sortedProtoPalIDs.end(), i), i);
	}
	// Begin with all proto-palettes queued up for insertion
	std::queue<ProtoPalAttrs> queue(
	    std::deque<ProtoPalAttrs>(sortedProtoPalIDs.begin(), sortedProtoPalIDs.end()));
	// Begin with no pages
	std::vector<AssignedProtos> assignments{};

	for (; !queue.empty(); queue.pop()) {
		ProtoPalAttrs const &attrs = queue.front(); // Valid until the `queue.pop()`
		options.verbosePrint(Options::VERB_DEBUG, "Handling proto-pal %zu\n", attrs.protoPalIndex);

		ProtoPalette const &protoPal = protoPalettes[attrs.protoPalIndex];
		size_t bestPalIndex = assignments.size();
		// We're looking for a palette where the proto-palette's relative size is less than
		// its actual size; so only overwrite the "not found" index on meeting that criterion
		double bestRelSize = protoPal.size();

		for (size_t i = 0; i < assignments.size(); ++i) {
			// Skip the page if this one is banned from it
			if (attrs.isBannedFrom(i)) {
				continue;
			}

			options.verbosePrint(Options::VERB_DEBUG, "%zu/%zu: Rel size: %f (size = %zu)\n", i + 1,
			                     assignments.size(), assignments[i].relSizeOf(protoPal),
			                     protoPal.size());
			if (assignments[i].relSizeOf(protoPal) < bestRelSize) {
				bestPalIndex = i;
			}
		}

		if (bestPalIndex == assignments.size()) {
			// Found nowhere to put it, create a new page containing just that one
			assignments.emplace_back(protoPalettes, std::move(attrs));
		} else {
			auto &bestPal = assignments[bestPalIndex];
			// Add the color to that palette
			bestPal.assign(std::move(attrs));

			// If this overloads the palette, get it back to normal (if possible)
			while (bestPal.volume() > options.maxOpaqueColors()) {
				options.verbosePrint(Options::VERB_DEBUG,
				                     "Palette %zu is overloaded! (%zu > %" PRIu8 ")\n",
				                     bestPalIndex, bestPal.volume(), options.maxOpaqueColors());

				// Look for a proto-pal minimizing "efficiency" (size / rel_size)
				auto efficiency = [&bestPal](ProtoPalette const &pal) {
					return pal.size() / bestPal.relSizeOf(pal);
				};
				auto [minEfficiencyIter, maxEfficiencyIter] =
				    std::minmax_element(bestPal.begin(), bestPal.end(),
				                        [&efficiency, &protoPalettes](ProtoPalAttrs const &lhs,
				                                                      ProtoPalAttrs const &rhs) {
					                        return efficiency(protoPalettes[lhs.protoPalIndex])
					                               < efficiency(protoPalettes[rhs.protoPalIndex]);
				                        });

				// All efficiencies are identical iff min equals max
				// TODO: maybe not ideal to re-compute these two?
				// TODO: yikes for float comparison! I *think* this threshold is OK?
				if (efficiency(protoPalettes[maxEfficiencyIter->protoPalIndex])
				        - efficiency(protoPalettes[minEfficiencyIter->protoPalIndex])
				    < .001) {
					break;
				}

				// Remove the proto-pal with minimal efficiency
				queue.emplace(std::move(*minEfficiencyIter));
				queue.back().banFrom(bestPalIndex); // Ban it from this palette
				bestPal.remove(minEfficiencyIter);
			}
		}
	}

	// Deal with palettes still overloaded, by emptying them
	for (AssignedProtos &pal : assignments) {
		if (pal.volume() > options.maxOpaqueColors()) {
			for (ProtoPalAttrs &attrs : pal) {
				queue.emplace(std::move(attrs));
			}
			pal.clear();
		}
	}
	// Place back any proto-palettes now in the queue via first-fit
	while (!queue.empty()) {
		ProtoPalAttrs const &attrs = queue.front();
		ProtoPalette const &protoPal = protoPalettes[attrs.protoPalIndex];
		auto iter =
		    std::find_if(assignments.begin(), assignments.end(),
		                 [&protoPal](AssignedProtos const &pal) { return pal.canFit(protoPal); });
		if (iter == assignments.end()) { // No such page, create a new one
			options.verbosePrint(Options::VERB_DEBUG,
			                     "Adding new palette (%zu) for overflowing proto-pal %zu\n",
			                     assignments.size(), attrs.protoPalIndex);
			assignments.emplace_back(protoPalettes, std::move(attrs));
		} else {
			options.verbosePrint(Options::VERB_DEBUG,
			                     "Assigning overflowing proto-pal %zu to palette %zu\n",
			                     attrs.protoPalIndex, iter - assignments.begin());
			iter->assign(std::move(attrs));
		}
		queue.pop();
	}

	if (options.verbosity >= Options::VERB_INTERM) {
		for (auto &&assignment : assignments) {
			fprintf(stderr, "{ ");
			for (auto &&attrs : assignment) {
				fprintf(stderr, "[%zu] ", attrs.protoPalIndex);
				for (auto &&colorIndex : protoPalettes[attrs.protoPalIndex]) {
					fprintf(stderr, "%04" PRIx16 ", ", colorIndex);
				}
			}
			fprintf(stderr, "} (volume = %zu)\n", assignment.volume());
		}
	}

	// "Decant" the result
	decant(assignments, protoPalettes);
	// Note that the result does not contain any empty palettes

	if (options.verbosity >= Options::VERB_INTERM) {
		for (auto &&assignment : assignments) {
			fprintf(stderr, "{ ");
			for (auto &&attrs : assignment) {
				fprintf(stderr, "[%zu] ", attrs.protoPalIndex);
				for (auto &&colorIndex : protoPalettes[attrs.protoPalIndex]) {
					fprintf(stderr, "%04" PRIx16 ", ", colorIndex);
				}
			}
			fprintf(stderr, "} (volume = %zu)\n", assignment.volume());
		}
	}

	DefaultInitVec<size_t> mappings(protoPalettes.size());
	for (size_t i = 0; i < assignments.size(); ++i) {
		for (ProtoPalAttrs const &attrs : assignments[i]) {
			mappings[attrs.protoPalIndex] = i;
		}
	}
	return {mappings, assignments.size()};
}